

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O1

void llama_sampler_logit_bias_apply(llama_sampler *smpl,llama_token_data_array *cur_p)

{
  llama_sampler_context_t pvVar1;
  llama_logit_bias *plVar2;
  llama_token_data *plVar3;
  iterator __position;
  int *piVar4;
  int *piVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  int *piVar9;
  llama_logit_bias *lb;
  llama_logit_bias *__args;
  
  pvVar1 = smpl->ctx;
  __args = *(llama_logit_bias **)((long)pvVar1 + 8);
  plVar2 = *(llama_logit_bias **)((long)pvVar1 + 0x10);
  if (__args != plVar2) {
    if (*(long *)((long)pvVar1 + 0x28) != *(long *)((long)pvVar1 + 0x20)) {
      *(long *)((long)pvVar1 + 0x28) = *(long *)((long)pvVar1 + 0x20);
    }
    if (__args != plVar2) {
      do {
        uVar7 = (ulong)__args->token;
        if ((((long)uVar7 < 0) || (cur_p->size <= uVar7)) ||
           (plVar3 = cur_p->data, plVar3[uVar7].id != __args->token)) {
          __position._M_current = *(llama_logit_bias **)((long)pvVar1 + 0x28);
          if (__position._M_current == *(llama_logit_bias **)((long)pvVar1 + 0x30)) {
            std::vector<llama_logit_bias,std::allocator<llama_logit_bias>>::
            _M_realloc_insert<llama_logit_bias_const&>
                      ((vector<llama_logit_bias,std::allocator<llama_logit_bias>> *)
                       ((long)pvVar1 + 0x20),__position,__args);
          }
          else {
            *__position._M_current = *__args;
            *(long *)((long)pvVar1 + 0x28) = *(long *)((long)pvVar1 + 0x28) + 8;
          }
        }
        else {
          plVar3[uVar7].logit = __args->bias + plVar3[uVar7].logit;
        }
        __args = __args + 1;
      } while (__args != plVar2);
    }
    piVar4 = *(int **)((long)pvVar1 + 0x20);
    piVar5 = *(int **)((long)pvVar1 + 0x28);
    if ((piVar4 != piVar5) && (sVar6 = cur_p->size, sVar6 != 0)) {
      sVar8 = 0;
      do {
        if (piVar4 != piVar5) {
          plVar3 = cur_p->data + sVar8;
          piVar9 = piVar4;
          do {
            if (plVar3->id == *piVar9) {
              plVar3->logit = (float)piVar9[1] + plVar3->logit;
              break;
            }
            piVar9 = piVar9 + 2;
          } while (piVar9 != piVar5);
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != sVar6);
    }
  }
  return;
}

Assistant:

static void llama_sampler_logit_bias_apply(struct llama_sampler * smpl, llama_token_data_array * cur_p) {
    auto * ctx = (llama_sampler_logit_bias *) smpl->ctx;

    if (ctx->logit_bias.empty()) {
        return;
    }

    ctx->to_search.clear();

    // update the candidates that have not been shuffled in the vocabulary (i.e. idx == id)
    for (const auto & lb : ctx->logit_bias) {
        if (lb.token >= 0 && cur_p->size > (size_t) lb.token && cur_p->data[lb.token].id == lb.token) {
            cur_p->data[lb.token].logit += lb.bias;
        } else {
            ctx->to_search.push_back(lb);
        }
    }

    if (ctx->to_search.empty()) {
        return;
    }

    // search for the remaining candidates that were not found in the previous step
    for (size_t i = 0; i < cur_p->size; ++i) {
        for (const auto & lb : ctx->to_search) {
            if (cur_p->data[i].id == lb.token) {
                cur_p->data[i].logit += lb.bias;
                break;
            }
        }
    }
}